

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLinearAction::IfcStructuralLinearAction
          (IfcStructuralLinearAction *this)

{
  IfcStructuralLinearAction *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1a8,"IfcStructuralLinearAction");
  IfcStructuralAction::IfcStructuralAction
            (&this->super_IfcStructuralAction,&PTR_construction_vtable_24__00ffa220);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLinearAction,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLinearAction,_1UL> *)
             &(this->super_IfcStructuralAction).field_0x178,&PTR_construction_vtable_24__00ffa358);
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject =
       0xffa0f0;
  *(undefined8 *)&this->field_0x1a8 = 0xffa208;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x88 = 0xffa118;
  (this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xffa140;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0xffa168;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.field_0x100 =
       0xffa190;
  *(undefined8 *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.field_0x138 =
       0xffa1b8;
  *(undefined8 *)&(this->super_IfcStructuralAction).field_0x178 = 0xffa1e0;
  std::__cxx11::string::string((string *)&(this->super_IfcStructuralAction).field_0x188);
  return;
}

Assistant:

IfcStructuralLinearAction() : Object("IfcStructuralLinearAction") {}